

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_post.c
# Opt level: O0

int unpost_form(FORM *form)

{
  int *piVar1;
  WINDOW_conflict *local_28;
  WINDOW_conflict *local_20;
  FORM *form_local;
  
  if (form == (FORM *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = -2;
    form_local._4_4_ = -2;
  }
  else if ((form->status & 1) == 0) {
    piVar1 = __errno_location();
    *piVar1 = -7;
    form_local._4_4_ = -7;
  }
  else if ((form->status & 2) == 0) {
    if ((form != (FORM *)0x0) && (form->fieldterm != (_func_void_formnode_ptr *)0x0)) {
      form->status = form->status | 2;
      (*form->fieldterm)(form);
      form->status = form->status & 0xfffd;
    }
    if ((form != (FORM *)0x0) && (form->formterm != (_func_void_formnode_ptr *)0x0)) {
      form->status = form->status | 2;
      (*form->formterm)(form);
      form->status = form->status & 0xfffd;
    }
    if (form->sub == (WINDOW_conflict *)0x0) {
      if (form->win == (WINDOW_conflict *)0x0) {
        local_28 = _stdscr;
      }
      else {
        local_28 = form->win;
      }
      local_20 = local_28;
    }
    else {
      local_20 = form->sub;
    }
    werase(local_20);
    delwin(form->w);
    form->w = (WINDOW_conflict *)0x0;
    form->status = form->status & 0xfffe;
    piVar1 = __errno_location();
    *piVar1 = 0;
    form_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = -5;
    form_local._4_4_ = -5;
  }
  return form_local._4_4_;
}

Assistant:

int unpost_form(FORM * form)
{
  if (!form)
    RETURN(E_BAD_ARGUMENT);

  if (!(form->status & _POSTED)) 
    RETURN(E_NOT_POSTED);

  if (form->status & _IN_DRIVER) 
    RETURN(E_BAD_STATE);

  Call_Hook(form,fieldterm);
  Call_Hook(form,formterm);

  werase(Get_Form_Window(form));
  delwin(form->w);
  form->w = (WINDOW *)0;
  form->status &= ~_POSTED;
  RETURN(E_OK);
}